

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O2

void wasm::Fuzzer::printTypes(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  pointer pHVar1;
  Printed PVar2;
  Printed PVar3;
  bool bVar4;
  ostream *poVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>,_bool>
  pVar9;
  undefined1 auStack_218 [8];
  IndexedTypeNameGenerator<FatalTypeNameGenerator> print;
  _Function_base local_180;
  undefined1 local_160 [8];
  unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  seen;
  Printed local_110;
  _Alloc_hider local_e8;
  anon_class_8_1_c7f65e1f inRecGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  optional<wasm::RecGroup> currRecGroup;
  __node_base_ptr p_Stack_68;
  _Alloc_hider local_60;
  value_type type;
  undefined8 local_32;
  FatalTypeNameGenerator fatalGenerator;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Built ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5," types:\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffa0,"",(allocator<char> *)((long)&local_32 + 1));
  print.defaultGenerator.arrayCount =
       (size_t)&print.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize;
  print.defaultGenerator.structCount = 0;
  auStack_218 = (undefined1  [8])0x0;
  print.defaultGenerator.funcCount = 0;
  print.defaultGenerator.nameCache._M_h._M_buckets = (__buckets_ptr)0x1;
  print.defaultGenerator.nameCache._M_h._M_bucket_count = 0;
  print.defaultGenerator.nameCache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  print.defaultGenerator.nameCache._M_h._M_element_count._0_4_ = 0x3f800000;
  print.defaultGenerator.nameCache._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  print.defaultGenerator.nameCache._M_h._M_rehash_policy._4_4_ = 0;
  print.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize = 0;
  print.defaultGenerator.nameCache._M_h._M_single_bucket = (__node_base_ptr)&local_32;
  print.fallback = (FatalTypeNameGenerator *)&print.names._M_h._M_rehash_policy._M_next_resize;
  print.names._M_h._M_buckets = (__buckets_ptr)0x1;
  print.names._M_h._M_bucket_count = 0;
  print.names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  print.names._M_h._M_element_count._0_4_ = 0x3f800000;
  print.names._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  print.names._M_h._M_rehash_policy._4_4_ = 0;
  print.names._M_h._M_rehash_policy._M_next_resize = 0;
  lVar8 = 0;
  for (uVar7 = 0;
      pHVar1 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(types->
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 3);
      uVar7 = uVar7 + 1) {
    std::__cxx11::to_string((string *)&stack0xffffffffffffff18,uVar7);
    std::operator+(&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffa0,(string *)&stack0xffffffffffffff18);
    IString::IString((IString *)local_a8,&local_c8);
    currRecGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::RecGroup>._8_8_ = &p_Stack_68;
    p_Stack_68 = (__node_base_ptr)0x0;
    std::pair<const_wasm::HeapType,_wasm::TypeNames>::
    pair<const_wasm::HeapType,_wasm::TypeNames,_true>
              ((pair<const_wasm::HeapType,_wasm::TypeNames> *)local_160,
               (HeapType *)((long)&pHVar1->id + lVar8),(TypeNames *)local_a8);
    std::
    _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<wasm::HeapType_const,wasm::TypeNames>>
              ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&print.fallback,(pair<const_wasm::HeapType,_wasm::TypeNames> *)local_160);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&seen._M_h._M_before_begin);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&currRecGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::RecGroup>._M_engaged);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
    lVar8 = lVar8 + 8;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  local_160 = (undefined1  [8])&seen._M_h._M_rehash_policy._M_next_resize;
  seen._M_h._M_buckets = (__buckets_ptr)0x1;
  seen._M_h._M_bucket_count = 0;
  seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen._M_h._M_element_count._0_4_ = 0x3f800000;
  seen._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  seen._M_h._M_rehash_policy._4_4_ = 0;
  seen._M_h._M_rehash_policy._M_next_resize = 0;
  currRecGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::RecGroup>._M_payload._M_value = (RecGroup)0x0;
  local_e8._M_p = local_a8;
  for (uVar7 = 0;
      pHVar1 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(types->
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 3);
      uVar7 = uVar7 + 1) {
    local_60._M_p = (pointer)pHVar1[uVar7].id;
    if ((pointer)0xd < local_60._M_p) {
      sVar6 = wasm::HeapType::getRecGroup();
      if ((currRecGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::RecGroup>._M_payload._M_value != (RecGroup)0x1) ||
         ((undefined1  [8])sVar6 != local_a8)) {
        bVar4 = printTypes::anon_class_8_1_c7f65e1f::operator()
                          ((anon_class_8_1_c7f65e1f *)&stack0xffffffffffffff18);
        if (bVar4) {
          std::operator<<((ostream *)&std::cout,")\n");
        }
        local_a8 = (undefined1  [8])wasm::HeapType::getRecGroup();
        if (currRecGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::RecGroup>._M_payload._M_value == (RecGroup)0x0) {
          currRecGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::RecGroup>._M_payload._M_value = (RecGroup)0x1;
        }
        bVar4 = printTypes::anon_class_8_1_c7f65e1f::operator()
                          ((anon_class_8_1_c7f65e1f *)&stack0xffffffffffffff18);
        if (bVar4) {
          std::operator<<((ostream *)&std::cout,"(rec\n");
        }
      }
    }
    bVar4 = printTypes::anon_class_8_1_c7f65e1f::operator()
                      ((anon_class_8_1_c7f65e1f *)&stack0xffffffffffffff18);
    if (bVar4) {
      std::operator<<((ostream *)&std::cout,' ');
    }
    if (local_60._M_p < (pointer)0xe) {
      poVar5 = std::operator<<((ostream *)&std::cout,"(type $");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,' ');
      TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_>::operator()
                ((Printed *)&print.names._M_h._M_single_bucket,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_> *)
                 auStack_218,(HeapType)local_60._M_p);
      PVar2.generateName.super__Function_base._M_functor._M_unused._M_member_pointer =
           print.defaultGenerator.funcCount;
      PVar2.typeID = (TypeID)auStack_218;
      PVar2.generateName.super__Function_base._M_functor._8_8_ = print.defaultGenerator.structCount;
      PVar2.generateName.super__Function_base._M_manager =
           (_Manager_type)print.defaultGenerator.arrayCount;
      PVar2.generateName._M_invoker =
           (_Invoker_type)print.defaultGenerator.nameCache._M_h._M_buckets;
      poVar5 = (ostream *)wasm::operator<<(poVar5,PVar2);
      std::operator<<(poVar5,")\n");
      std::_Function_base::~_Function_base(&local_180);
    }
    else {
      local_c8._M_dataplus._M_p = local_60._M_p;
      local_c8._M_string_length = uVar7;
      pVar9 = std::
              _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_long>>
                        ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)local_160,&local_c8);
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"(type $");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5," identical to $");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5,")");
      }
      else {
        TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_>::operator()
                  (&local_110,
                   (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_> *
                   )auStack_218,(HeapType)local_60._M_p);
        PVar3.generateName.super__Function_base._M_functor._M_unused._M_member_pointer =
             print.defaultGenerator.funcCount;
        PVar3.typeID = (TypeID)auStack_218;
        PVar3.generateName.super__Function_base._M_functor._8_8_ =
             print.defaultGenerator.structCount;
        PVar3.generateName.super__Function_base._M_manager =
             (_Manager_type)print.defaultGenerator.arrayCount;
        PVar3.generateName._M_invoker =
             (_Invoker_type)print.defaultGenerator.nameCache._M_h._M_buckets;
        wasm::operator<<((ostream *)&std::cout,PVar3);
        std::_Function_base::~_Function_base(&local_110.generateName.super__Function_base);
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
  }
  bVar4 = printTypes::anon_class_8_1_c7f65e1f::operator()
                    ((anon_class_8_1_c7f65e1f *)&stack0xffffffffffffff18);
  if (bVar4) {
    std::operator<<((ostream *)&std::cout,")\n");
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  IndexedTypeNameGenerator<FatalTypeNameGenerator>::~IndexedTypeNameGenerator
            ((IndexedTypeNameGenerator<FatalTypeNameGenerator> *)auStack_218);
  return;
}

Assistant:

void Fuzzer::printTypes(const std::vector<HeapType>& types) {
  std::cout << "Built " << types.size() << " types:\n";
  struct FatalTypeNameGenerator
    : TypeNameGeneratorBase<FatalTypeNameGenerator> {
    TypeNames getNames(HeapType type) {
      Fatal() << "trying to print unknown heap type";
    }
  } fatalGenerator;
  IndexedTypeNameGenerator<FatalTypeNameGenerator> print(types, fatalGenerator);
  std::unordered_map<HeapType, size_t> seen;
  std::optional<RecGroup> currRecGroup;
  auto inRecGroup = [&]() { return currRecGroup && currRecGroup->size() > 1; };
  for (size_t i = 0; i < types.size(); ++i) {
    auto type = types[i];
    if (!type.isBasic() && type.getRecGroup() != currRecGroup) {
      if (inRecGroup()) {
        std::cout << ")\n";
      }
      currRecGroup = type.getRecGroup();
      if (inRecGroup()) {
        std::cout << "(rec\n";
      }
    }
    if (inRecGroup()) {
      std::cout << ' ';
    }
    if (type.isBasic()) {
      std::cout << "(type $" << i << ' ' << print(type) << ")\n";
      continue;
    }
    auto [it, inserted] = seen.insert({type, i});
    if (inserted) {
      std::cout << print(type);
    } else {
      std::cout << "(type $" << i << " identical to $" << it->second << ")";
    }
    std::cout << "\n";
  }
  if (inRecGroup()) {
    std::cout << ")\n";
  }
}